

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::LexFloat(AsciiParser *this,string *result)

{
  int *piVar1;
  uint8_t uVar2;
  int iVar3;
  ulong uVar4;
  ostringstream oVar5;
  StreamReader *pSVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  char *pcVar12;
  ostringstream oVar13;
  ostringstream ss_e;
  stringstream ss;
  string local_350;
  ostringstream local_330;
  undefined7 uStack_32f;
  long local_320 [12];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar6 = this->_sr;
  uVar9 = pSVar6->idx_;
  if (uVar9 + 1 <= pSVar6->length_) {
    oVar13 = *(ostringstream *)(pSVar6->binary_ + uVar9);
    pSVar6->idx_ = uVar9 + 1;
    iVar3 = (this->_curr_cursor).col;
    (this->_curr_cursor).col = iVar3 + 1;
    if ((oVar13 == (ostringstream)0x2d) || (oVar13 == (ostringstream)0x2b)) {
      local_330 = oVar13;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
      pSVar6 = this->_sr;
      uVar8 = pSVar6->length_;
      uVar4 = pSVar6->idx_;
      uVar9 = uVar4 + 1;
      if (uVar9 <= uVar8) {
        uVar2 = pSVar6->binary_[uVar4];
        pSVar6->idx_ = uVar9;
        if (uVar2 == '.') {
          piVar1 = &(this->_curr_cursor).col;
          *piVar1 = *piVar1 + 1;
          local_330 = (ostringstream)0x2e;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
          pSVar6 = this->_sr;
          goto LAB_0033021d;
        }
        if (uVar4 <= uVar8 && uVar4 < 0x7fffffffffffffff) {
          pSVar6->idx_ = uVar4;
          uVar9 = uVar4;
        }
        goto LAB_00330086;
      }
    }
    else {
      if ((byte)((char)oVar13 - 0x30U) < 10) {
        local_330 = oVar13;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
        pSVar6 = this->_sr;
        uVar8 = pSVar6->length_;
        uVar9 = pSVar6->idx_;
LAB_00330086:
        if (uVar9 < uVar8) {
          while( true ) {
            oVar13 = *(ostringstream *)(pSVar6->binary_ + uVar9);
            if (oVar13 == (ostringstream)0x0) break;
            pSVar6->idx_ = uVar9 + 1;
            if (9 < (byte)((char)oVar13 - 0x30U)) {
              if ((uVar9 < 0x7fffffffffffffff) && (uVar9 <= pSVar6->length_)) {
                pSVar6->idx_ = uVar9;
              }
              break;
            }
            local_330 = oVar13;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
            pSVar6 = this->_sr;
            uVar9 = pSVar6->idx_;
            if (pSVar6->length_ <= uVar9) break;
          }
        }
LAB_0033021d:
        uVar9 = pSVar6->length_;
        uVar8 = pSVar6->idx_;
        if ((uVar8 < uVar9) &&
           (oVar13 = *(ostringstream *)(pSVar6->binary_ + uVar8), oVar13 != (ostringstream)0x0)) {
          uVar8 = uVar8 + 1;
          pSVar6->idx_ = uVar8;
          if (oVar13 == (ostringstream)0x2e) {
            local_330 = (ostringstream)0x2e;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
            pSVar6 = this->_sr;
            uVar9 = pSVar6->length_;
            uVar8 = pSVar6->idx_;
            oVar13 = (ostringstream)0x2e;
            if (uVar8 < uVar9) {
              if (*(ostringstream *)(pSVar6->binary_ + uVar8) == (ostringstream)0x0) {
                oVar13 = (ostringstream)0x2e;
              }
              else {
                oVar5 = *(ostringstream *)(pSVar6->binary_ + uVar8);
                while (oVar13 = oVar5, pSVar6->idx_ = uVar8 + 1, (byte)((char)oVar13 - 0x30U) < 10)
                {
                  local_330 = oVar13;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(char *)&local_330,1);
                  pSVar6 = this->_sr;
                  uVar8 = pSVar6->idx_;
                  if ((pSVar6->length_ <= uVar8) ||
                     (oVar5 = *(ostringstream *)(pSVar6->binary_ + uVar8),
                     *(ostringstream *)(pSVar6->binary_ + uVar8) == (ostringstream)0x0)) break;
                }
              }
              uVar9 = pSVar6->length_;
              uVar8 = pSVar6->idx_;
            }
          }
          else if (((byte)oVar13 & 0xdf) != 0x45) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)result,(string *)&local_330);
            if ((long *)CONCAT71(uStack_32f,local_330) != local_320) {
              operator_delete((long *)CONCAT71(uStack_32f,local_330),local_320[0] + 1);
            }
            pSVar6 = this->_sr;
            bVar11 = true;
            if ((0 < (long)pSVar6->idx_) && (uVar9 = pSVar6->idx_ - 1, uVar9 <= pSVar6->length_)) {
              pSVar6->idx_ = uVar9;
            }
            goto LAB_003304bc;
          }
          if ((uVar8 < uVar9) && (pSVar6->binary_[uVar8] != '\0')) {
            if (((byte)oVar13 & 0xdf) == 0x45) {
              local_330 = oVar13;
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
              pSVar6 = this->_sr;
              uVar9 = pSVar6->idx_ + 1;
              if (pSVar6->length_ < uVar9) goto LAB_003301fe;
              oVar13 = *(ostringstream *)(pSVar6->binary_ + pSVar6->idx_);
              pSVar6->idx_ = uVar9;
              if ((oVar13 == (ostringstream)0x2d) || (oVar13 == (ostringstream)0x2b)) {
                local_330 = oVar13;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1)
                ;
                bVar11 = true;
              }
              else {
                if (9 < (byte)((char)oVar13 - 0x30U)) {
                  ::std::__cxx11::ostringstream::ostringstream(&local_330);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,"LexFloat",8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<(&local_330,0xb8a);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  pcVar12 = "Empty `E\' is not allowed.";
                  lVar10 = 0x19;
                  goto LAB_0033018d;
                }
                local_330 = oVar13;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1)
                ;
                bVar11 = false;
              }
              pSVar6 = this->_sr;
              uVar9 = pSVar6->idx_;
              if (uVar9 < pSVar6->length_) {
                while( true ) {
                  oVar13 = *(ostringstream *)(pSVar6->binary_ + uVar9);
                  if (oVar13 == (ostringstream)0x0) break;
                  pSVar6->idx_ = uVar9 + 1;
                  if ((byte)((char)oVar13 - 0x30U) < 10) {
                    local_330 = oVar13;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_330,1);
                  }
                  else {
                    if ((oVar13 != (ostringstream)0x2d) && (oVar13 != (ostringstream)0x2b)) {
                      if ((uVar9 < 0x7fffffffffffffff) && (uVar9 <= pSVar6->length_)) {
                        pSVar6->idx_ = uVar9;
                      }
                      break;
                    }
                    if (bVar11) {
                      ::std::__cxx11::ostringstream::ostringstream(&local_330);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_330,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_330,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_330,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_330,"LexFloat",8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_330,"():",3);
                      poVar7 = (ostream *)::std::ostream::operator<<(&local_330,0xb99);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      pcVar12 = "No multiple exponential sign characters.";
                      lVar10 = 0x28;
                      goto LAB_0033018d;
                    }
                    local_330 = oVar13;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_330,1);
                    bVar11 = true;
                  }
                  pSVar6 = this->_sr;
                  uVar9 = pSVar6->idx_;
                  if (pSVar6->length_ <= uVar9) break;
                }
              }
            }
            else if ((0 < (long)uVar8) && (uVar8 - 1 <= uVar9)) {
              pSVar6->idx_ = uVar8 - 1;
            }
          }
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)result,(string *)&local_330);
        if ((long *)CONCAT71(uStack_32f,local_330) != local_320) {
          operator_delete((long *)CONCAT71(uStack_32f,local_330),local_320[0] + 1);
        }
        bVar11 = true;
        goto LAB_003304bc;
      }
      if (oVar13 == (ostringstream)0x2e) {
        bVar11 = false;
        if (((long)uVar9 < 0) || (bVar11 = false, pSVar6->length_ < uVar9)) goto LAB_003304bc;
        pSVar6->idx_ = uVar9;
        (this->_curr_cursor).col = iVar3;
        goto LAB_0033021d;
      }
      ::std::__cxx11::ostringstream::ostringstream(&local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"LexFloat",8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(&local_330,0xb32);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar12 = "Sign or `.` or 0-9 expected.";
      lVar10 = 0x1c;
LAB_0033018d:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,pcVar12,lVar10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(&local_330);
      ::std::ios_base::~ios_base(local_2c0);
    }
  }
LAB_003301fe:
  bVar11 = false;
LAB_003304bc:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar11;
}

Assistant:

bool AsciiParser::LexFloat(std::string *result) {
  // FLOATVAL : ('+' or '-')? FLOAT
  // FLOAT
  //     :   ('0'..'9')+ '.' ('0'..'9')* EXPONENT?
  //     |   '.' ('0'..'9')+ EXPONENT?
  //     |   ('0'..'9')+ EXPONENT
  //     ;
  // EXPONENT : ('e'|'E') ('+'|'-')? ('0'..'9')+ ;

  std::stringstream ss;

  bool has_sign{false};
  bool leading_decimal_dots{false};
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign, '.' or [0-9]
    if ((sc == '+') || (sc == '-')) {
      ss << sc;
      has_sign = true;

      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '.') {
        // ok. something like `+.7`, `-.53`
        leading_decimal_dots = true;
        _curr_cursor.col++;
        ss << c;

      } else {
        // unwind and continue
        _sr->seek_from_current(-1);
      }

    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
      ss << sc;
    } else if (sc == '.') {
      // ok but rescan again in 2.
      leading_decimal_dots = true;
      if (!Rewind(1)) {
        return false;
      }
      _curr_cursor.col--;
    } else {
      PUSH_ERROR_AND_RETURN("Sign or `.` or 0-9 expected.");
    }
  }

  (void)has_sign;

  // 1. Read the integer part
  char curr;
  if (!leading_decimal_dots) {
    // std::cout << "1 read int part: ss = " << ss.str() << "\n";

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      // std::cout << "1 curr = " << curr << "\n";
      if ((curr >= '0') && (curr <= '9')) {
        // continue
        ss << curr;
      } else {
        _sr->seek_from_current(-1);
        break;
      }
    }
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  if (!Char1(&curr)) {
    return false;
  }

  // std::cout << "before 2: ss = " << ss.str() << ", curr = " << curr <<
  // "\n";

  // 2. Read the decimal part
  if (curr == '.') {
    ss << curr;

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        ss << curr;
      } else {
        break;
      }
    }

  } else if ((curr == 'e') || (curr == 'E')) {
    // go to 3.
  } else {
    // end
    (*result) = ss.str();
    _sr->seek_from_current(-1);
    return true;
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  // 3. Read the exponent part
  bool has_exp_sign{false};
  if ((curr == 'e') || (curr == 'E')) {
    ss << curr;

    if (!Char1(&curr)) {
      return false;
    }

    if ((curr == '+') || (curr == '-')) {
      // exp sign
      ss << curr;
      has_exp_sign = true;

    } else if ((curr >= '0') && (curr <= '9')) {
      // ok
      ss << curr;
    } else {
      // Empty E is not allowed.
      PUSH_ERROR_AND_RETURN("Empty `E' is not allowed.");
    }

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        // ok
        ss << curr;

      } else if ((curr == '+') || (curr == '-')) {
        if (has_exp_sign) {
          // No multiple sign characters
          PUSH_ERROR_AND_RETURN("No multiple exponential sign characters.");
        }

        ss << curr;
        has_exp_sign = true;
      } else {
        // end
        _sr->seek_from_current(-1);
        break;
      }
    }
  } else {
    _sr->seek_from_current(-1);
  }

  (*result) = ss.str();
  return true;
}